

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable-common.h
# Opt level: O0

size_type __thiscall
google::sparsehash_internal::sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>::
min_buckets(sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *this,size_type num_elts
           ,size_type min_buckets_wanted)

{
  length_error *this_00;
  ulong uVar1;
  ulong in_RDX;
  ulong in_RSI;
  sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *in_RDI;
  bool bVar2;
  float fVar3;
  size_type sz;
  float enlarge;
  float local_3c;
  ulong local_28;
  
  fVar3 = enlarge_factor(in_RDI);
  local_28 = 4;
  while( true ) {
    bVar2 = true;
    if (in_RDX <= local_28) {
      local_3c = (float)local_28;
      uVar1 = (ulong)(local_3c * fVar3);
      bVar2 = (uVar1 | (long)(local_3c * fVar3 - 9.223372e+18) & (long)uVar1 >> 0x3f) <= in_RSI;
    }
    if (!bVar2) break;
    if (local_28 << 1 < local_28) {
      this_00 = (length_error *)__cxa_allocate_exception(0x10);
      std::length_error::length_error(this_00,"resize overflow");
      __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
    }
    local_28 = local_28 << 1;
  }
  return local_28;
}

Assistant:

size_type min_buckets(size_type num_elts, size_type min_buckets_wanted) {
    float enlarge = enlarge_factor();
    size_type sz = HT_MIN_BUCKETS;  // min buckets allowed
    while (sz < min_buckets_wanted ||
           num_elts >= static_cast<size_type>(sz * enlarge)) {
      // This just prevents overflowing size_type, since sz can exceed
      // max_size() here.
      if (static_cast<size_type>(sz * 2) < sz) {
        throw std::length_error("resize overflow");  // protect against overflow
      }
      sz *= 2;
    }
    return sz;
  }